

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_profiler.c
# Opt level: O2

sunTimerStruct * sunTimerStructNew(void)

{
  sunTimerStruct *psVar1;
  sunTimespec *psVar2;
  
  psVar1 = (sunTimerStruct *)malloc(0x30);
  psVar2 = (sunTimespec *)calloc(1,0x10);
  psVar1->tic = psVar2;
  psVar2 = (sunTimespec *)malloc(0x10);
  psVar1->toc = psVar2;
  psVar1->average = 0.0;
  psVar1->maximum = 0.0;
  psVar1->elapsed = 0.0;
  psVar1->count = 0;
  return psVar1;
}

Assistant:

static sunTimerStruct* sunTimerStructNew(void)
{
  sunTimerStruct* ts = (sunTimerStruct*)malloc(sizeof(sunTimerStruct));
  ts->tic            = (sunTimespec*)malloc(sizeof(sunTimespec));
  ts->toc            = (sunTimespec*)malloc(sizeof(sunTimespec));
  ts->tic->tv_sec    = 0;
  ts->tic->tv_nsec   = 0;
  ts->elapsed        = 0.0;
  ts->average        = 0.0;
  ts->maximum        = 0.0;
  ts->count          = 0;
  return ts;
}